

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O2

void rb_insert_node(rb_node **rbt,rb_node *rbn,ly_bool *max_p)

{
  int iVar1;
  rb_node *prVar2;
  rb_node *prVar3;
  rb_node *prVar4;
  rb_node **pprVar5;
  code *pcVar6;
  ly_bool lVar7;
  
  pcVar6 = rb_compare_lists;
  if ((*rbt)->dnode->schema->nodetype == 8) {
    pcVar6 = rb_compare_leaflists;
  }
  lVar7 = '\x01';
  iVar1 = 0;
  prVar3 = (rb_node *)0x0;
  for (prVar4 = *rbt; prVar4 != (rb_node *)0x0; prVar4 = (&prVar4->left)[iVar1 < 1]) {
    iVar1 = (*pcVar6)(prVar4->dnode,rbn->dnode);
    if (0 < iVar1) {
      lVar7 = '\0';
    }
    prVar3 = prVar4;
  }
  rbn->parent = prVar3;
  rbn->left = (rb_node *)0x0;
  rbn->right = (rb_node *)0x0;
  rbn->color = '\x01';
  pprVar5 = rbt;
  if (prVar3 != (rb_node *)0x0) {
    if (iVar1 < 1) {
      pprVar5 = &prVar3->right;
    }
    else {
      pprVar5 = &prVar3->left;
    }
  }
  *pprVar5 = rbn;
  do {
    while( true ) {
      prVar3 = rbn->parent;
      if ((prVar3 == (rb_node *)0x0) || (prVar3->color != '\x01')) {
        (*rbt)->color = '\0';
        if (max_p != (ly_bool *)0x0) {
          *max_p = lVar7;
        }
        return;
      }
      prVar4 = prVar3->parent;
      prVar2 = prVar4->left;
      if (prVar3 == prVar2) break;
      if ((prVar2 == (rb_node *)0x0) || (prVar2->color != '\x01')) {
        prVar2 = prVar3;
        if (prVar3->left == rbn) {
          rb_rotate_right(rbt,prVar3);
          prVar2 = rbn;
          rbn = prVar3;
        }
        prVar2->color = '\0';
        prVar4->color = '\x01';
        rb_rotate_left(rbt,prVar4);
      }
      else {
LAB_00151cca:
        prVar2->color = '\0';
        prVar3->color = '\0';
        prVar4->color = '\x01';
        rbn = prVar4;
      }
    }
    prVar2 = prVar4->right;
    if ((prVar2 != (rb_node *)0x0) && (prVar2->color == '\x01')) goto LAB_00151cca;
    prVar2 = prVar3;
    if (prVar3->right == rbn) {
      rb_rotate_left(rbt,prVar3);
      prVar2 = rbn;
      rbn = prVar3;
    }
    prVar2->color = '\0';
    prVar4->color = '\x01';
    rb_rotate_right(rbt,prVar4);
  } while( true );
}

Assistant:

static void
rb_insert_node(struct rb_node **rbt, struct rb_node *rbn, ly_bool *max_p)
{
    ly_bool max;
    struct rb_node *tmp;
    struct rb_node *parent = NULL;
    int comp = 0;

    int (*rb_compare)(const struct lyd_node *n1, const struct lyd_node *n2);

    if (RBN_DNODE(*rbt)->schema->nodetype == LYS_LEAFLIST) {
        rb_compare = rb_compare_leaflists;
    } else {
        rb_compare = rb_compare_lists;
    }

    max = 1;
    tmp = *rbt;
    while (tmp != NULL) {
        parent = tmp;

        comp = rb_compare(RBN_DNODE(tmp), RBN_DNODE(rbn));
        if (comp > 0) {
            tmp = RBN_LEFT(tmp);
            max = 0;
        } else {
            tmp = RBN_RIGHT(tmp);
        }
    }

    rb_set(rbn, parent);

    if (parent != NULL) {
        if (comp > 0) {
            RBN_LEFT(parent) = rbn;
        } else {
            RBN_RIGHT(parent) = rbn;
        }
    } else {
        *rbt = rbn;
    }

    rb_insert_color(rbt, rbn);

    if (max_p) {
        *max_p = max;
    }
}